

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Slice leveldb::anon_unknown_1::PosixWritableFile::Basename(string *filename)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_type separator_pos;
  string *filename_local;
  
  lVar1 = std::__cxx11::string::rfind((char)filename,0x2f);
  if (lVar1 == -1) {
    Slice::Slice((Slice *)&filename_local,filename);
  }
  else {
    lVar2 = std::__cxx11::string::find((char)filename,0x2f);
    if (lVar2 != -1) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix.cc"
                    ,0x1a2,
                    "static Slice leveldb::(anonymous namespace)::PosixWritableFile::Basename(const std::string &)"
                   );
    }
    lVar2 = std::__cxx11::string::data();
    lVar3 = std::__cxx11::string::length();
    Slice::Slice((Slice *)&filename_local,(char *)(lVar2 + lVar1 + 1),(lVar3 - lVar1) - 1);
  }
  return _filename_local;
}

Assistant:

static Slice Basename(const std::string& filename) {
    std::string::size_type separator_pos = filename.rfind('/');
    if (separator_pos == std::string::npos) {
      return Slice(filename);
    }
    // The filename component should not contain a path separator. If it does,
    // the splitting was done incorrectly.
    assert(filename.find('/', separator_pos + 1) == std::string::npos);

    return Slice(filename.data() + separator_pos + 1,
                 filename.length() - separator_pos - 1);
  }